

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getNextLeak
          (MemoryLeakDetectorTable *this,MemoryLeakDetectorNode *leak,MemLeakPeriod period)

{
  MemoryLeakDetectorNode *cur;
  MemoryLeakDetectorNode *pMVar1;
  ulong uVar2;
  
  pMVar1 = *(MemoryLeakDetectorNode **)(leak + 0x38);
  if (pMVar1 == (MemoryLeakDetectorNode *)0x0 || period == mem_leak_period_all) {
    if (pMVar1 != (MemoryLeakDetectorNode *)0x0) {
      return pMVar1;
    }
  }
  else {
    do {
      if (*(MemLeakPeriod *)(pMVar1 + 0x30) == period) {
        return pMVar1;
      }
      if (period == mem_leak_period_enabled &&
          *(MemLeakPeriod *)(pMVar1 + 0x30) != mem_leak_period_disabled) {
        return pMVar1;
      }
      pMVar1 = *(MemoryLeakDetectorNode **)(pMVar1 + 0x38);
    } while (pMVar1 != (MemoryLeakDetectorNode *)0x0);
  }
  uVar2 = *(ulong *)(leak + 0x10) % 0x49;
  do {
    if (0x47 < uVar2) {
      return (MemoryLeakDetectorNode *)0x0;
    }
    pMVar1 = this->table_[uVar2 + 1].head_;
    if ((period != mem_leak_period_all) && (pMVar1 != (MemoryLeakDetectorNode *)0x0)) {
      do {
        if (*(MemLeakPeriod *)(pMVar1 + 0x30) == period) {
          return pMVar1;
        }
        if (period == mem_leak_period_enabled &&
            *(MemLeakPeriod *)(pMVar1 + 0x30) != mem_leak_period_disabled) {
          return pMVar1;
        }
        pMVar1 = *(MemoryLeakDetectorNode **)(pMVar1 + 0x38);
      } while (pMVar1 != (MemoryLeakDetectorNode *)0x0);
      pMVar1 = (MemoryLeakDetectorNode *)0x0;
    }
    uVar2 = uVar2 + 1;
    if (pMVar1 != (MemoryLeakDetectorNode *)0x0) {
      return pMVar1;
    }
  } while( true );
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getNextLeak(MemoryLeakDetectorNode* leak, MemLeakPeriod period)
{
    unsigned long i = hash(leak->memory_);
    MemoryLeakDetectorNode* node = table_[i].getNextLeak(leak, period);
    if (node) return node;

    for (++i; i < hash_prime; i++) {
        node = table_[i].getFirstLeak(period);
        if (node) return node;
    }
    return NULLPTR;
}